

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O1

int xcb_input_input_state_data_serialize
              (void **_buffer,uint8_t class_id,xcb_input_input_state_data_t *_aux)

{
  int iVar1;
  int iVar2;
  long lVar3;
  void *__dest;
  uint uVar4;
  int iVar5;
  undefined7 in_register_00000031;
  int iVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  bool bVar8;
  uint xcb_pad;
  char xcb_pad0 [3];
  iovec xcb_parts [11];
  uint local_f0;
  undefined2 local_ec;
  undefined1 local_ea;
  xcb_input_input_state_data_t *local_e8;
  ulong local_e0;
  uint *local_d8 [2];
  uint8_t *local_c8;
  long local_c0 [18];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  __dest = *_buffer;
  local_f0 = 0;
  local_ea = 0;
  local_ec = 0;
  memset(&local_e8,0xaa,0xb0);
  iVar6 = 0;
  iVar1 = 0;
  bVar8 = (int)CONCAT71(in_register_00000031,class_id) == 0;
  if (bVar8) {
    local_e8 = _aux;
    local_e0 = 1;
    local_d8[0] = &local_f0;
    local_d8[1] = (uint *)0x1;
    local_c8 = (_aux->key).keys;
    local_c0[0] = 0x20;
    iVar1 = 0x22;
    iVar6 = 3;
  }
  uVar4 = (uint)bVar8;
  if (class_id == '\x01') {
    uVar7 = (ulong)(uint)(iVar6 << 4);
    *(anon_struct_34_3_966d0470_for_button **)((long)&local_e8 + uVar7) = &_aux->button;
    *(undefined8 *)((long)&local_e0 + uVar7) = 1;
    *(uint **)((long)local_d8 + uVar7) = &local_f0;
    *(undefined8 *)((long)local_d8 + uVar7 + 8) = 1;
    *(uint8_t **)((long)local_c0 + (uVar7 - 8)) = (_aux->button).buttons;
    iVar1 = iVar1 + 0x22;
    *(undefined8 *)((long)local_c0 + uVar7) = 0x20;
    iVar6 = iVar6 + 3;
    uVar4 = 1;
  }
  if (class_id == '\x02') {
    uVar7 = (ulong)(uint)(iVar6 << 4);
    *(anon_struct_16_3_69a6ec01_for_valuator **)((long)&local_e8 + uVar7) = &_aux->valuator;
    *(undefined8 *)((long)&local_e0 + uVar7) = 1;
    *(uint8_t **)((long)local_d8 + uVar7) = &(_aux->valuator).mode;
    *(undefined8 *)((long)local_d8 + uVar7 + 8) = 1;
    iVar2 = iVar1 + 2;
    *(int32_t **)((long)local_c0 + (uVar7 - 8)) = (_aux->valuator).valuators;
    lVar3 = (ulong)(_aux->valuator).num_valuators << 2;
    iVar1 = (int)lVar3;
    *(long *)((long)local_c0 + uVar7) = lVar3;
    iVar6 = iVar6 + 3;
    iVar5 = 0;
    uVar4 = 4;
  }
  else {
    iVar5 = -2;
    iVar2 = 0;
  }
  uVar4 = uVar4 - 1 & iVar5 - iVar1;
  local_f0 = uVar4;
  if (uVar4 != 0) {
    *(undefined2 **)((long)&local_e8 + (ulong)(uint)(iVar6 << 4)) = &local_ec;
    *(ulong *)((long)&local_e0 + (ulong)(uint)(iVar6 << 4)) = (ulong)uVar4;
    iVar6 = iVar6 + 1;
    local_f0 = 0;
  }
  uVar4 = iVar2 + iVar1 + uVar4;
  if (__dest == (void *)0x0) {
    __dest = malloc((ulong)uVar4);
    *_buffer = __dest;
  }
  if (iVar6 != 0) {
    uVar7 = 0;
    do {
      if ((*(void **)((long)&local_e8 + uVar7) != (void *)0x0) &&
         (*(size_t *)((long)&local_e0 + uVar7) != 0)) {
        memcpy(__dest,*(void **)((long)&local_e8 + uVar7),*(size_t *)((long)&local_e0 + uVar7));
      }
      __dest = (void *)((long)__dest + *(long *)((long)&local_e0 + uVar7));
      uVar7 = uVar7 + 0x10;
    } while ((uint)(iVar6 << 4) != uVar7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return uVar4;
  }
  __stack_chk_fail();
}

Assistant:

int
xcb_input_input_state_data_serialize (void                               **_buffer,
                                      uint8_t                              class_id,
                                      const xcb_input_input_state_data_t  *_aux)
{
    char *xcb_out = *_buffer;
    unsigned int xcb_buffer_len = 0;
    unsigned int xcb_align_to = 0;
    unsigned int xcb_padding_offset = 2;

    unsigned int xcb_pad = 0;
    char xcb_pad0[3] = {0, 0, 0};
    struct iovec xcb_parts[11];
    unsigned int xcb_parts_idx = 0;
    unsigned int xcb_block_len = 0;
    unsigned int i;
    char *xcb_tmp;

    if(class_id == XCB_INPUT_INPUT_CLASS_KEY) {
        /* xcb_input_input_state_data_t.key.num_keys */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->key.num_keys;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_input_state_data_t.key.pad0 */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &xcb_pad;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_input_state_data_t.key.keys */
        xcb_parts[xcb_parts_idx].iov_base = (char *) _aux->key.keys;
        xcb_block_len += 32;
        xcb_parts[xcb_parts_idx].iov_len = 32;
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
    }
    if(class_id == XCB_INPUT_INPUT_CLASS_BUTTON) {
        /* xcb_input_input_state_data_t.button.num_buttons */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->button.num_buttons;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_input_state_data_t.button.pad1 */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &xcb_pad;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_input_state_data_t.button.buttons */
        xcb_parts[xcb_parts_idx].iov_base = (char *) _aux->button.buttons;
        xcb_block_len += 32;
        xcb_parts[xcb_parts_idx].iov_len = 32;
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
    }
    if(class_id == XCB_INPUT_INPUT_CLASS_VALUATOR) {
        /* xcb_input_input_state_data_t.valuator.num_valuators */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->valuator.num_valuators;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_input_state_data_t.valuator.mode */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->valuator.mode;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* insert padding */
        xcb_pad = -(xcb_block_len + xcb_padding_offset) & (xcb_align_to - 1);
        xcb_buffer_len += xcb_block_len + xcb_pad;
        if (0 != xcb_pad) {
            xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
            xcb_parts[xcb_parts_idx].iov_len = xcb_pad;
            xcb_parts_idx++;
            xcb_pad = 0;
        }
        xcb_block_len = 0;
        xcb_padding_offset = 0;
        /* valuators */
        xcb_parts[xcb_parts_idx].iov_base = (char *) _aux->valuator.valuators;
        xcb_block_len += _aux->valuator.num_valuators * sizeof(int32_t);
        xcb_parts[xcb_parts_idx].iov_len = _aux->valuator.num_valuators * sizeof(int32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int32_t);
    }
    /* insert padding */
    xcb_pad = -(xcb_block_len + xcb_padding_offset) & (xcb_align_to - 1);
    xcb_buffer_len += xcb_block_len + xcb_pad;
    if (0 != xcb_pad) {
        xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
        xcb_parts[xcb_parts_idx].iov_len = xcb_pad;
        xcb_parts_idx++;
        xcb_pad = 0;
    }
    xcb_block_len = 0;
    xcb_padding_offset = 0;

    if (NULL == xcb_out) {
        /* allocate memory */
        xcb_out = malloc(xcb_buffer_len);
        *_buffer = xcb_out;
    }

    xcb_tmp = xcb_out;
    for(i=0; i<xcb_parts_idx; i++) {
        if (0 != xcb_parts[i].iov_base && 0 != xcb_parts[i].iov_len)
            memcpy(xcb_tmp, xcb_parts[i].iov_base, xcb_parts[i].iov_len);
        if (0 != xcb_parts[i].iov_len)
            xcb_tmp += xcb_parts[i].iov_len;
    }

    return xcb_buffer_len;
}